

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall QPDFObjectHandle::makeResourcesIndirect(QPDFObjectHandle *this,QPDF *owning_qpdf)

{
  _Rb_tree_node_base *this_00;
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this);
  iVar2 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&local_60);
  iVar3 = ::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&local_60);
  for (; iVar2._M_node != iVar3._M_node;
      iVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar2._M_node)) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(iVar2._M_node + 2)
              );
    iVar4 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&local_70);
    iVar5 = ::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&local_70);
    for (; iVar4._M_node != iVar5._M_node;
        iVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar4._M_node)) {
      this_00 = iVar4._M_node + 2;
      bVar1 = ::qpdf::BaseHandle::null((BaseHandle *)this_00);
      if ((!bVar1) && ((*(long *)this_00 == 0 || (*(int *)(*(long *)this_00 + 0x50) == 0)))) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_50,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this_00);
        QPDF::makeIndirectObject((QPDF *)&local_40,(QPDFObjectHandle *)owning_qpdf);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this_00,&local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  return;
}

Assistant:

void
QPDFObjectHandle::makeResourcesIndirect(QPDF& owning_qpdf)
{
    for (auto const& i1: as_dictionary()) {
        for (auto& i2: i1.second.as_dictionary()) {
            if (!i2.second.null() && !i2.second.isIndirect()) {
                i2.second = owning_qpdf.makeIndirectObject(i2.second);
            }
        }
    }
}